

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index.h
# Opt level: O0

void __thiscall
booster::locale::boundary::details::
segment_index_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::segment_index_iterator
          (segment_index_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *this,bool is_begin,mapping_type *map,rule_type mask,bool full_select)

{
  undefined4 in_ECX;
  undefined8 in_RDX;
  byte in_SIL;
  long in_RDI;
  byte in_R8B;
  segment_index_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *unaff_retaddr;
  
  segment<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::segment((segment<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)0x13f982);
  std::pair<unsigned_long,_unsigned_long>::pair<unsigned_long,_unsigned_long,_true>
            ((pair<unsigned_long,_unsigned_long> *)(in_RDI + 0x18));
  *(undefined8 *)(in_RDI + 0x28) = in_RDX;
  *(undefined4 *)(in_RDI + 0x30) = in_ECX;
  *(byte *)(in_RDI + 0x34) = in_R8B & 1;
  if ((in_SIL & 1) == 0) {
    set_end(unaff_retaddr);
  }
  else {
    set_begin(unaff_retaddr);
  }
  return;
}

Assistant:

segment_index_iterator(bool is_begin,mapping_type const *map,rule_type mask,bool full_select) :
                        map_(map),
                        mask_(mask),
                        full_select_(full_select)
                    {
                        if(is_begin)
                            set_begin();
                        else
                            set_end();
                    }